

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_UnaryExpr_Test::ExprTest_UnaryExpr_Test(ExprTest_UnaryExpr_Test *this)

{
  ExprTest::ExprTest(&this->super_ExprTest);
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_0018eeb0;
  return;
}

Assistant:

TEST_F(ExprTest, UnaryExpr) {
  mp::UnaryExpr e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  auto arg = factory_.MakeNumericConstant(42);
  e = MakeUnary(expr::ABS, arg);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::ABS, e.kind());
  EXPECT_EQ(arg, e.arg());
  EXPECT_ASSERT(MakeUnary(expr::ADD, arg), "invalid expression kind");
  EXPECT_ASSERT(MakeUnary(expr::ABS, NumericExpr()),
                "invalid argument");
}